

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

code_point
booster::locale::utf::utf_traits<unsigned_short,2>::decode<unsigned_short_const*>
          (unsigned_short **current,unsigned_short *last)

{
  ushort uVar1;
  ushort *puVar2;
  code_point cVar3;
  
  puVar2 = *current;
  cVar3 = 0xfffffffe;
  if (puVar2 != last) {
    *current = puVar2 + 1;
    uVar1 = *puVar2;
    if ((ushort)(uVar1 + 0x2000) < 0xf800) {
      return (uint)uVar1;
    }
    if (0xdbff < uVar1) {
      return 0xffffffff;
    }
    if (puVar2 + 1 != last) {
      *current = puVar2 + 2;
      cVar3 = 0xffffffff;
      if (0xfbff < (ushort)(puVar2[1] + 0x2000)) {
        cVar3 = (uVar1 & 0x3ff) * 0x400 + (puVar2[1] & 0x3ff) + 0x10000;
      }
    }
  }
  return cVar3;
}

Assistant:

static code_point decode(It &current,It last)
        {
            if(BOOSTER_LOCALE_UNLIKELY(current == last))
                return incomplete;
            uint16_t w1=*current++;
            if(BOOSTER_LOCALE_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
                return w1;
            }
            if(w1 > 0xDBFF)
                return illegal;
            if(current==last)
                return incomplete;
            uint16_t w2=*current++;
            if(w2 < 0xDC00 || 0xDFFF < w2)
                return illegal;
            return combine_surrogate(w1,w2);
        }